

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

bool __thiscall gui::ChatBox::handleKeyPressed(ChatBox *this,KeyEvent *key)

{
  pointer puVar1;
  size_type sVar2;
  String *right;
  unsigned_long *puVar3;
  long lVar4;
  KeyEvent *in_RSI;
  Widget *in_RDI;
  size_t i;
  size_t selectionMax;
  size_t selectionMin;
  String selectedText;
  bool eventConsumed;
  undefined1 in_stack_000001ff;
  ChatBox *in_stack_00000200;
  String *in_stack_fffffffffffffef8;
  deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *in_stack_ffffffffffffff00;
  int delta;
  ChatBox *in_stack_ffffffffffffff30;
  locale *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  size_t in_stack_ffffffffffffff58;
  ChatBox *in_stack_ffffffffffffff60;
  pointer local_68;
  bool local_1;
  
  local_1 = Widget::handleKeyPressed(in_RDI,in_RSI);
  if (((ulong)in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent & 1) == 0) {
    if ((in_RSI->control & 1U) == 0) {
      delta = (int)((ulong)in_RDI >> 0x20);
      if (in_RSI->code == PageUp) {
        updateScroll(in_stack_ffffffffffffff30,delta);
      }
      else if (in_RSI->code == PageDown) {
        updateScroll(in_stack_ffffffffffffff30,delta);
      }
      else if (in_RSI->code == Home) {
        *(undefined8 *)(in_RDI[1].transformable_.m_transform.m_matrix + 0xf) = 0;
        updateVisibleLines(in_stack_00000200,(bool)in_stack_000001ff);
      }
      else if (in_RSI->code == End) {
        sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                          ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x2351a6);
        if (sVar2 == 0) {
          lVar4 = 0;
        }
        else {
          sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                            ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x2351bd)
          ;
          lVar4 = sVar2 - 1;
        }
        *(long *)(in_RDI[1].transformable_.m_transform.m_matrix + 0xf) = lVar4;
        updateVisibleLines(in_stack_00000200,(bool)in_stack_000001ff);
      }
      else if (in_RSI->code == Up) {
        updateScroll(in_stack_ffffffffffffff30,delta);
      }
      else {
        if (in_RSI->code != Down) {
          return local_1;
        }
        updateScroll(in_stack_ffffffffffffff30,delta);
      }
      local_1 = true;
    }
    else {
      if (in_RSI->code == A) {
        sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                          ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x234e40);
        if (sVar2 != 0) {
          updateSelection(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          (bool)in_stack_ffffffffffffff57);
          std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                    ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x234e67);
          updateSelection(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          (bool)in_stack_ffffffffffffff57);
        }
      }
      else {
        if ((in_RSI->code != X) && (in_RSI->code != C)) {
          return local_1;
        }
        if (((uint)in_RDI[1].transformable_.m_inverseTransform.m_matrix[2] & 1) != 0) {
          sf::String::String((String *)0x234ebf);
          right = (String *)
                  std::min<unsigned_long>
                            ((unsigned_long *)&in_RDI[1].transformable_.m_inverseTransform,
                             (unsigned_long *)
                             (in_RDI[1].transformable_.m_inverseTransform.m_matrix + 4));
          local_68 = (right->m_string)._M_dataplus._M_p;
          puVar3 = std::max<unsigned_long>
                             ((unsigned_long *)&in_RDI[1].transformable_.m_inverseTransform,
                              (unsigned_long *)
                              (in_RDI[1].transformable_.m_inverseTransform.m_matrix + 4));
          puVar1 = (pointer)*puVar3;
          for (; local_68 <= puVar1; local_68 = (pointer)((long)local_68 + 1)) {
            std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::operator[]
                      (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            std::locale::locale((locale *)&stack0xffffffffffffff30);
            sf::String::String((String *)
                               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
            sf::operator+((String *)in_RDI,right);
            sf::operator+((String *)in_RDI,right);
            sf::String::operator=((String *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
            sf::String::~String((String *)0x234fe4);
            sf::String::~String((String *)0x234fee);
            sf::String::~String((String *)0x234ff8);
            std::locale::~locale((locale *)&stack0xffffffffffffff30);
          }
          sf::Clipboard::setString((String *)0x2350c4);
          sf::String::~String((String *)0x2350d3);
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ChatBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (autoHide_) {
        return eventConsumed;
    }

    if (key.control) {
        if (key.code == sf::Keyboard::A) {
            if (lines_.size() > 0) {
                updateSelection(0, false);
                updateSelection(lines_.size() - 1, true);
            }
        } else if (key.code == sf::Keyboard::X || key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::String selectedText;
                size_t selectionMin = std::min(selectionStart_.first, selectionEnd_);
                size_t selectionMax = std::max(selectionStart_.first, selectionEnd_);
                for (size_t i = selectionMin; i <= selectionMax; ++i) {
                    selectedText = lines_[i].str + "\n" + selectedText;
                }
                sf::Clipboard::setString(selectedText);
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::PageUp) {
        updateScroll(static_cast<int>(sizeCharacters_.y) - 1);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateScroll(-static_cast<int>(sizeCharacters_.y) + 1);
    } else if (key.code == sf::Keyboard::Home) {
        verticalScroll_ = 0;
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::End) {
        verticalScroll_ = (lines_.size() > 0 ? lines_.size() - 1 : 0);
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::Up) {
        updateScroll(1);
    } else if (key.code == sf::Keyboard::Down) {
        updateScroll(-1);
    } else {
        return eventConsumed;
    }
    return true;
}